

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiasLayerParams::InternalSwap(BiasLayerParams *this,BiasLayerParams *other)

{
  int iVar1;
  WeightParams *pWVar2;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shape_,&other->shape_);
  pWVar2 = this->bias_;
  this->bias_ = other->bias_;
  other->bias_ = pWVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void BiasLayerParams::InternalSwap(BiasLayerParams* other) {
  shape_.InternalSwap(&other->shape_);
  std::swap(bias_, other->bias_);
  std::swap(_cached_size_, other->_cached_size_);
}